

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void moveto_node_add(lyxp_set *set,lyd_node *node,uint32_t pos,uint32_t i,int *replaced)

{
  undefined4 in_register_0000000c;
  
  if (*(int *)CONCAT44(in_register_0000000c,i) != 0) {
    set_insert_node(set,node,0,LYXP_NODE_ELEM,pos);
    return;
  }
  (set->val).nodes[pos].node = node;
  (set->val).nodes[pos].type = LYXP_NODE_ELEM;
  (set->val).nodes[pos].pos = 0;
  *(int *)CONCAT44(in_register_0000000c,i) = 1;
  return;
}

Assistant:

static void
moveto_node_add(struct lyxp_set *set, struct lyd_node *node, uint32_t pos, uint32_t i, int *replaced)
{
    if (!(*replaced)) {
        set->val.nodes[i].node = node;
        set->val.nodes[i].type = LYXP_NODE_ELEM;
        set->val.nodes[i].pos = pos;
        *replaced = 1;
    } else {
        set_insert_node(set, node, pos, LYXP_NODE_ELEM, i);
    }
}